

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O2

void __thiscall OpenMD::Bond::calcForce(Bond *this,bool doParticlePot)

{
  RealType *particlePot;
  Atom *this_00;
  Vector<double,_3U> *v1;
  undefined7 in_register_00000031;
  double dVar1;
  RealType dvdr;
  Vector3d force;
  Vector3d r12;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  OpenMD local_60 [24];
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_48);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)local_60);
  StuntDouble::getPos((Vector3d *)&local_78,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_90,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble);
  operator-(&local_a8,&local_78,&local_90);
  Vector3<double>::operator=((Vector3<double> *)&local_48,&local_a8);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_48);
  dVar1 = Vector<double,_3U>::length(&local_48);
  particlePot = &this->potential_;
  (*this->bondType_->_vptr_BondType[2])(this->bondType_,particlePot,&local_90);
  operator*(&local_a8,&local_48,-local_90.data_[0] / dVar1);
  Vector3<double>::operator=((Vector3<double> *)local_60,&local_a8);
  this_00 = *(this->super_ShortRangeInteraction).atoms_.
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  operator-(&local_78,local_60,v1);
  Vector<double,_3U>::Vector(&local_a8,&local_78);
  StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)&local_a8);
  StuntDouble::addFrc(&(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble,(Vector3d *)local_60);
  if ((int)CONCAT71(in_register_00000031,doParticlePot) != 0) {
    StuntDouble::addParticlePot
              (&(*(this->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot
              (&(this->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start[1]->super_StuntDouble,particlePot);
  }
  return;
}

Assistant:

void calcForce(bool doParticlePot) {
      RealType len;
      RealType dvdr;
      Vector3d r12;
      Vector3d force;

      r12 = atoms_[1]->getPos() - atoms_[0]->getPos();
      snapshotMan_->getCurrentSnapshot()->wrapVector(r12);
      len = r12.length();
      bondType_->calcForce(len, potential_, dvdr);

      force = r12 * (-dvdr / len);

      atoms_[0]->addFrc(-force);
      atoms_[1]->addFrc(force);
      if (doParticlePot) {
        atoms_[0]->addParticlePot(potential_);
        atoms_[1]->addParticlePot(potential_);
      }
    }